

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

QRect __thiscall QtMWidgets::SliderPrivate::grooveRect(SliderPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  QRect QVar8;
  
  auVar7 = QWidget::contentsRect();
  iVar1 = QAbstractSlider::orientation();
  uVar6 = auVar7._0_4_;
  uVar4 = auVar7._4_4_;
  if (iVar1 == 2) {
    iVar1 = this->grooveHeight;
    iVar3 = (int)(((auVar7._8_4_ - iVar1) - uVar6) + 1) / 2 + uVar6;
    iVar2 = uVar4 + 1;
    iVar5 = ~uVar4 + auVar7._12_4_;
  }
  else {
    iVar3 = uVar6 + 1;
    iVar5 = this->grooveHeight;
    iVar2 = (int)(((auVar7._12_4_ - iVar5) - uVar4) + 1) / 2 + uVar4;
    iVar1 = ~uVar6 + auVar7._8_4_;
  }
  QVar8.x2 = iVar3 + iVar1 + -1;
  QVar8.y1 = iVar2;
  QVar8.x1 = iVar3;
  QVar8.y2 = iVar5 + iVar2 + -1;
  return QVar8;
}

Assistant:

QRect
SliderPrivate::grooveRect() const
{
	const QRect cr = q->contentsRect();

	int gx = 0, gy = 0, gw = 0, gh = 0;

	if( q->orientation() == Qt::Vertical )
	{
		gx = cr.topLeft().x() + ( cr.width() - grooveHeight ) / 2;
		gy = cr.topLeft().y() + 1;
		gw = grooveHeight;
		gh = cr.height() - 2;
	}
	else
	{
		gx = cr.topLeft().x() + 1;
		gy = cr.topLeft().y() + ( cr.height() - grooveHeight ) / 2;
		gw = cr.width() - 2;
		gh = grooveHeight;
	}

	return QRect( gx, gy, gw, gh );
}